

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O0

hash_manifest_result_t
manifest_verify(string *manifest_file,string *hash_type_str,string *hash_str,string *tensor_name)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  __type _Var4;
  ulong uVar5;
  istream *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RDI;
  string file_tensor_name;
  string file_hash;
  string file_hash_type;
  istringstream line_stream;
  string manifest_entry_line;
  ifstream file;
  int in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  undefined7 in_stack_fffffffffffffba0;
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  istringstream local_3e0 [384];
  string local_260 [32];
  int local_240;
  istream local_230 [544];
  undefined8 local_10;
  hash_manifest_result_t local_4;
  
  local_10 = in_RDI;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::ifstream::ifstream(local_230,local_10,8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      local_4 = HASH_MANIFEST_NOT_FOUND;
      local_240 = 1;
    }
    else {
      std::__cxx11::string::string(local_260);
      do {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_230,local_260)
        ;
        uVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!(bool)uVar2) {
          local_4 = HASH_MANIFEST_NOT_FOUND;
          local_240 = 1;
          break;
        }
        std::__cxx11::istringstream::istringstream(local_3e0,local_260,8);
        std::__cxx11::string::string(local_400);
        std::__cxx11::string::string(local_420);
        std::__cxx11::string::string(local_440);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::operator>>((istream *)local_3e0,local_400);
        piVar6 = std::operator>>((istream *)__rhs,local_420);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::operator>>(piVar6,local_440);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(&__lhs->_M_dataplus + *(long *)(*(long *)__lhs + -0x18)));
        in_stack_fffffffffffffb7c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb7c);
        if (bVar3) {
          bVar3 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffb7c,
                                                    in_stack_fffffffffffffb78));
          if (bVar3) {
            local_240 = 2;
          }
          else {
            bVar3 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffffb7c,
                                                      in_stack_fffffffffffffb78));
            if (bVar3) {
              local_240 = 2;
            }
            else {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(uVar2,in_stack_fffffffffffffba0),__rhs);
              local_4 = HASH_MANIFEST_MISMATCH;
              if (_Var4) {
                local_4 = HASH_MANIFEST_OK;
              }
              local_240 = 1;
            }
          }
        }
        else {
          local_240 = 0;
        }
        std::__cxx11::string::~string(local_440);
        std::__cxx11::string::~string(local_420);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::istringstream::~istringstream(local_3e0);
        in_stack_fffffffffffffb78 = local_240;
      } while ((local_240 == 0) || (local_240 == 2));
      std::__cxx11::string::~string(local_260);
    }
    std::ifstream::~ifstream(local_230);
  }
  else {
    local_4 = HASH_MANIFEST_NOT_FOUND;
  }
  return local_4;
}

Assistant:

static hash_manifest_result_t manifest_verify(const std::string& manifest_file, const std::string& hash_type_str, const std::string& hash_str, const std::string& tensor_name) {
    if (manifest_file.empty()) {
        return HASH_MANIFEST_NOT_FOUND;
    }

    std::ifstream file(manifest_file);
    if (!file.is_open()) {
        return HASH_MANIFEST_NOT_FOUND;
    }

    std::string manifest_entry_line;
    while (getline(file, manifest_entry_line)) {
        std::istringstream line_stream(manifest_entry_line);
        std::string file_hash_type;
        std::string file_hash;
        std::string file_tensor_name;
        if (line_stream >> file_hash_type >> file_hash >> file_tensor_name) {
            // Line parsed. Check hash validity

            if (file_hash_type != hash_type_str) {
                continue;
            }

            if (file_tensor_name != tensor_name) {
                continue;
            }

            return (file_hash == hash_str) ? HASH_MANIFEST_OK : HASH_MANIFEST_MISMATCH;
        }
    }

    return HASH_MANIFEST_NOT_FOUND;
}